

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void setarrayvector(lua_State *L,Table *t,uint size)

{
  TValue *pTVar1;
  int *piVar2;
  ulong uVar3;
  
  pTVar1 = (TValue *)luaM_realloc_(L,t->array,(ulong)t->sizearray << 4,(ulong)size << 4);
  t->array = pTVar1;
  uVar3 = (ulong)t->sizearray;
  piVar2 = &pTVar1[uVar3].tt_;
  for (; uVar3 < size; uVar3 = uVar3 + 1) {
    *piVar2 = 0;
    piVar2 = piVar2 + 4;
  }
  t->sizearray = size;
  return;
}

Assistant:

static void setarrayvector (lua_State *L, Table *t, unsigned int size) {
  unsigned int i;
  luaM_reallocvector(L, t->array, t->sizearray, size, TValue);
  for (i=t->sizearray; i<size; i++)
     setnilvalue(&t->array[i]);
  t->sizearray = size;
}